

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateOperandDebugType
          (ValidationState_t *_,string *debug_inst_name,Instruction *inst,uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name,bool allow_template_param)

{
  bool bVar1;
  spv_ext_inst_type_t *psVar2;
  DiagnosticStream *pDVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  DiagnosticStream local_268;
  anon_class_8_1_2e3b433c local_90;
  undefined1 local_88 [8];
  function<bool_(CommonDebugInfoInstructions)> expectation;
  undefined1 local_60 [8];
  function<bool_(NonSemanticShaderDebugInfo100Instructions)> expectation_1;
  bool allow_template_param_local;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *ext_inst_name_local;
  uint32_t word_index_local;
  Instruction *inst_local;
  string *debug_inst_name_local;
  ValidationState_t *__local;
  
  expectation_1._M_invoker._7_1_ = allow_template_param;
  psVar2 = Instruction::ext_inst_type(inst);
  if (*psVar2 == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
    std::function<bool(NonSemanticShaderDebugInfo100Instructions)>::
    function<spvtools::val::(anonymous_namespace)::ValidateOperandDebugType(spvtools::val::ValidationState_t&,std::__cxx11::string_const&,spvtools::val::Instruction_const*,unsigned_int,std::function<std::__cxx11::string()>const&,bool)::__0,void>
              ((function<bool(NonSemanticShaderDebugInfo100Instructions)> *)local_60,
               (anon_class_1_0_00000001 *)((long)&expectation._M_invoker + 7));
    expectation._M_invoker._0_1_ =
         DoesDebugInfoOperandMatchExpectation
                   (_,(function<bool_(NonSemanticShaderDebugInfo100Instructions)> *)local_60,inst,
                    word_index);
    if (expectation._M_invoker._0_1_) {
      __local._4_4_ = SPV_SUCCESS;
    }
    expectation._M_invoker._1_3_ = 0;
    std::function<bool_(NonSemanticShaderDebugInfo100Instructions)>::~function
              ((function<bool_(NonSemanticShaderDebugInfo100Instructions)> *)local_60);
    if ((uint)expectation._M_invoker != 0) {
      return __local._4_4_;
    }
  }
  local_90.allow_template_param = (bool *)((long)&expectation_1._M_invoker + 7);
  std::function<bool(CommonDebugInfoInstructions)>::
  function<spvtools::val::(anonymous_namespace)::ValidateOperandDebugType(spvtools::val::ValidationState_t&,std::__cxx11::string_const&,spvtools::val::Instruction_const*,unsigned_int,std::function<std::__cxx11::string()>const&,bool)::__1,void>
            ((function<bool(CommonDebugInfoInstructions)> *)local_88,&local_90);
  bVar1 = DoesDebugInfoOperandMatchExpectation
                    (_,(function<bool_(CommonDebugInfoInstructions)> *)local_88,inst,word_index);
  if (bVar1) {
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    ValidationState_t::diag(&local_268,_,SPV_ERROR_INVALID_DATA,inst);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(&local_288,ext_inst_name);
    pDVar3 = DiagnosticStream::operator<<(&local_268,&local_288);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [3])0x3cdfe0);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [18])0x3dcaf8);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,debug_inst_name);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [27])" is not a valid debug type");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    std::__cxx11::string::~string((string *)&local_288);
    DiagnosticStream::~DiagnosticStream(&local_268);
  }
  expectation._M_invoker._0_4_ = 1;
  std::function<bool_(CommonDebugInfoInstructions)>::~function
            ((function<bool_(CommonDebugInfoInstructions)> *)local_88);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateOperandDebugType(
    ValidationState_t& _, const std::string& debug_inst_name,
    const Instruction* inst, uint32_t word_index,
    const std::function<std::string()>& ext_inst_name,
    bool allow_template_param) {
  // Check for NonSemanticShaderDebugInfo100 specific types.
  if (inst->ext_inst_type() ==
      SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
    std::function<bool(NonSemanticShaderDebugInfo100Instructions)> expectation =
        [](NonSemanticShaderDebugInfo100Instructions dbg_inst) {
          return dbg_inst == NonSemanticShaderDebugInfo100DebugTypeMatrix;
        };
    if (DoesDebugInfoOperandMatchExpectation(_, expectation, inst, word_index))
      return SPV_SUCCESS;
  }

  // Check for common types.
  std::function<bool(CommonDebugInfoInstructions)> expectation =
      [&allow_template_param](CommonDebugInfoInstructions dbg_inst) {
        if (allow_template_param &&
            (dbg_inst == CommonDebugInfoDebugTypeTemplateParameter ||
             dbg_inst == CommonDebugInfoDebugTypeTemplateTemplateParameter)) {
          return true;
        }
        return CommonDebugInfoDebugTypeBasic <= dbg_inst &&
               dbg_inst <= CommonDebugInfoDebugTypeTemplate;
      };
  if (DoesDebugInfoOperandMatchExpectation(_, expectation, inst, word_index))
    return SPV_SUCCESS;

  return _.diag(SPV_ERROR_INVALID_DATA, inst)
         << ext_inst_name() << ": "
         << "expected operand " << debug_inst_name
         << " is not a valid debug type";
}